

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlayout.cpp
# Opt level: O1

void __thiscall QLayout::addChildLayout(QLayout *this,QLayout *childLayout)

{
  QWidget *mw;
  
  if (*(long *)(*(long *)&childLayout->field_0x8 + 0x10) == 0) {
    QObject::setParent(&childLayout->super_QObject);
    mw = parentWidget(this);
    if (mw != (QWidget *)0x0) {
      QLayoutPrivate::reparentChildWidgets(*(QLayoutPrivate **)&childLayout->field_0x8,mw);
      return;
    }
  }
  else {
    addChildLayout(childLayout);
  }
  return;
}

Assistant:

void QLayout::addChildLayout(QLayout *childLayout)
{
    if (Q_UNLIKELY(childLayout->parent())) {
        qWarning("QLayout::addChildLayout: layout %s \"%ls\" already has a parent",
                 childLayout->metaObject()->className(), qUtf16Printable(childLayout->objectName()));
        return;
    }
    childLayout->setParent(this);

    if (QWidget *mw = parentWidget()) {
        childLayout->d_func()->reparentChildWidgets(mw);
    }

}